

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase451::run(TestCase451 *this)

{
  StructDataBitCount *this_00;
  uint64_t uVar1;
  initializer_list<capnp::Text::Reader> value;
  initializer_list<capnp::Text::Reader> value_00;
  initializer_list<capnp::Text::Reader> value_01;
  initializer_list<int> value_02;
  initializer_list<int> value_03;
  initializer_list<int> value_04;
  ulong uVar2;
  uint uVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  size_t sVar5;
  size_t sVar6;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> WVar7;
  word *pwVar8;
  word *pwVar9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar10;
  bool local_d29;
  size_t sStack_d28;
  bool _kj_shouldLog_11;
  size_t local_d20;
  ulong local_d18;
  size_t i;
  size_t local_d08;
  bool local_cf9;
  undefined1 auStack_cf8 [7];
  bool _kj_shouldLog_10;
  size_t local_cf0;
  undefined1 local_ce8 [8];
  ArrayPtr<const_capnp::word> defaultSegment;
  Builder local_cb0;
  undefined1 local_c88 [8];
  MallocMessageBuilder defaultBuilder;
  undefined1 auStack_b88 [8];
  ArrayPtr<const_capnp::word> segment;
  Builder local_b70;
  Builder local_b48;
  Builder local_b20;
  Builder local_af8;
  Builder local_ad0;
  Builder local_aa8;
  Builder local_a80;
  Builder local_a58;
  undefined1 local_a30 [8];
  Builder l_9;
  Reader local_9f8;
  StructDataBitCount *local_9e8;
  undefined8 local_9e0;
  Reader local_9d8;
  iterator local_9c8;
  undefined8 local_9c0;
  Reader local_9b8;
  Reader local_9a8;
  iterator local_998;
  undefined8 local_990;
  undefined1 local_988 [8];
  Builder l_8;
  int local_948 [2];
  iterator local_940;
  undefined8 local_938;
  int local_92c [3];
  iterator local_920;
  undefined8 local_918;
  undefined1 local_910 [8];
  Builder l_7;
  Builder local_8d8;
  ArrayPtr<const_char> local_8b0;
  Builder local_8a0;
  undefined1 local_878 [8];
  Builder l_6;
  Builder local_828;
  undefined1 local_800 [8];
  Builder l_5;
  Builder local_7b0;
  undefined1 local_788 [8];
  Builder l_4;
  Builder local_738;
  undefined1 local_710 [8];
  Builder l_3;
  Builder local_6c0;
  undefined1 local_698 [8];
  Builder l_2;
  Builder local_648;
  Builder local_620;
  Builder local_5f8;
  undefined1 local_5d0 [8];
  Builder l_1;
  Builder local_5a0;
  Builder local_570;
  undefined1 local_548 [8];
  Builder l;
  uint local_4f4;
  uint local_4f0;
  bool local_4e9;
  undefined1 local_4e8 [7];
  bool _kj_shouldLog_9;
  Builder local_4c0;
  uint local_494;
  uint local_490;
  bool local_489;
  undefined1 local_488 [7];
  bool _kj_shouldLog_8;
  Builder local_460;
  uint local_434;
  uint local_430;
  bool local_429;
  undefined1 local_428 [7];
  bool _kj_shouldLog_7;
  Builder local_400;
  uint local_3d4;
  uint local_3d0;
  bool local_3c9;
  undefined1 local_3c8 [7];
  bool _kj_shouldLog_6;
  Builder local_3a0;
  uint local_374;
  uint local_370;
  bool local_369;
  undefined1 local_368 [7];
  bool _kj_shouldLog_5;
  Builder local_340;
  uint local_314;
  uint local_310;
  bool local_309;
  undefined1 local_308 [7];
  bool _kj_shouldLog_4;
  Builder local_2e0;
  uint local_2b4;
  uint local_2b0;
  bool local_2a9;
  undefined1 local_2a8 [7];
  bool _kj_shouldLog_3;
  Builder local_280;
  uint local_254;
  uint local_250;
  bool local_249;
  undefined1 local_248 [7];
  bool _kj_shouldLog_2;
  Builder local_220;
  uint local_1f4;
  uint local_1f0;
  bool local_1e9;
  undefined1 local_1e8 [7];
  bool _kj_shouldLog_1;
  Builder local_1c0;
  uint local_194;
  uint local_190;
  bool local_189;
  undefined1 local_188 [7];
  bool _kj_shouldLog;
  undefined1 local_160 [8];
  Builder sl;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase451 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestListDefaults>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestListDefaults::Builder::initLists
            ((Builder *)local_160,(Builder *)local_128);
  capnproto_test::capnp::test::TestLists::Builder::getList0
            ((Builder *)local_188,(Builder *)local_160);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_188);
  if (uVar3 != 0) {
    local_189 = kj::_::Debug::shouldLog(ERROR);
    while (local_189 != false) {
      local_190 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getList0(&local_1c0,(Builder *)local_160);
      local_194 = List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Builder::
                  size(&local_1c0);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1cc,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getList0 ().size())\", 0u, sl.getList0 ().size()"
                 ,(char (*) [49])"failed: expected (0u) == (sl.getList0 ().size())",&local_190,
                 &local_194);
      local_189 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getList1
            ((Builder *)local_1e8,(Builder *)local_160);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_1e8);
  if (uVar3 != 0) {
    local_1e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e9 != false) {
      local_1f0 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getList1(&local_220,(Builder *)local_160);
      local_1f4 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::
                  size(&local_220);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1cd,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getList1 ().size())\", 0u, sl.getList1 ().size()"
                 ,(char (*) [49])"failed: expected (0u) == (sl.getList1 ().size())",&local_1f0,
                 &local_1f4);
      local_1e9 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getList8
            ((Builder *)local_248,(Builder *)local_160);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_248);
  if (uVar3 != 0) {
    local_249 = kj::_::Debug::shouldLog(ERROR);
    while (local_249 != false) {
      local_250 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getList8(&local_280,(Builder *)local_160);
      local_254 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::
                  size(&local_280);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1ce,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getList8 ().size())\", 0u, sl.getList8 ().size()"
                 ,(char (*) [49])"failed: expected (0u) == (sl.getList8 ().size())",&local_250,
                 &local_254);
      local_249 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getList16
            ((Builder *)local_2a8,(Builder *)local_160);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_2a8);
  if (uVar3 != 0) {
    local_2a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a9 != false) {
      local_2b0 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getList16(&local_2e0,(Builder *)local_160);
      local_2b4 = List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::
                  size(&local_2e0);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1cf,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getList16().size())\", 0u, sl.getList16().size()"
                 ,(char (*) [49])"failed: expected (0u) == (sl.getList16().size())",&local_2b0,
                 &local_2b4);
      local_2a9 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getList32
            ((Builder *)local_308,(Builder *)local_160);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_308);
  if (uVar3 != 0) {
    local_309 = kj::_::Debug::shouldLog(ERROR);
    while (local_309 != false) {
      local_310 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getList32(&local_340,(Builder *)local_160);
      local_314 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::
                  size(&local_340);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1d0,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getList32().size())\", 0u, sl.getList32().size()"
                 ,(char (*) [49])"failed: expected (0u) == (sl.getList32().size())",&local_310,
                 &local_314);
      local_309 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getList64
            ((Builder *)local_368,(Builder *)local_160);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_368);
  if (uVar3 != 0) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (local_369 != false) {
      local_370 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getList64(&local_3a0,(Builder *)local_160);
      local_374 = List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Builder::
                  size(&local_3a0);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1d1,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getList64().size())\", 0u, sl.getList64().size()"
                 ,(char (*) [49])"failed: expected (0u) == (sl.getList64().size())",&local_370,
                 &local_374);
      local_369 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getListP
            ((Builder *)local_3c8,(Builder *)local_160);
  uVar3 = List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_3c8);
  if (uVar3 != 0) {
    local_3c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c9 != false) {
      local_3d0 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getListP(&local_400,(Builder *)local_160);
      local_3d4 = List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::
                  size(&local_400);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1d2,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getListP ().size())\", 0u, sl.getListP ().size()"
                 ,(char (*) [49])"failed: expected (0u) == (sl.getListP ().size())",&local_3d0,
                 &local_3d4);
      local_3c9 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getInt32ListList
            ((Builder *)local_428,(Builder *)local_160);
  uVar3 = List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::size
                    ((Builder *)local_428);
  if (uVar3 != 0) {
    local_429 = kj::_::Debug::shouldLog(ERROR);
    while (local_429 != false) {
      local_430 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getInt32ListList
                (&local_460,(Builder *)local_160);
      local_434 = List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::size(&local_460);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1d3,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getInt32ListList().size())\", 0u, sl.getInt32ListList().size()"
                 ,(char (*) [56])"failed: expected (0u) == (sl.getInt32ListList().size())",
                 &local_430,&local_434);
      local_429 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getTextListList
            ((Builder *)local_488,(Builder *)local_160);
  uVar3 = List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::size
                    ((Builder *)local_488);
  if (uVar3 != 0) {
    local_489 = kj::_::Debug::shouldLog(ERROR);
    while (local_489 != false) {
      local_490 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getTextListList
                (&local_4c0,(Builder *)local_160);
      local_494 = List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::size
                            (&local_4c0);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1d4,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getTextListList().size())\", 0u, sl.getTextListList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (sl.getTextListList().size())",&local_490
                 ,&local_494);
      local_489 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::getStructListList
            ((Builder *)local_4e8,(Builder *)local_160);
  uVar3 = List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
          ::Builder::size((Builder *)local_4e8);
  if (uVar3 != 0) {
    local_4e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4e9 != false) {
      local_4f0 = 0;
      capnproto_test::capnp::test::TestLists::Builder::getStructListList
                ((Builder *)&l.builder.structDataSize,(Builder *)local_160);
      local_4f4 = List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
                  ::Builder::size((Builder *)&l.builder.structDataSize);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x1d5,ERROR,
                 "\"failed: expected \" \"(0u) == (sl.getStructListList().size())\", 0u, sl.getStructListList().size()"
                 ,(char (*) [57])"failed: expected (0u) == (sl.getStructListList().size())",
                 &local_4f0,&local_4f4);
      local_4e9 = false;
    }
  }
  capnproto_test::capnp::test::TestLists::Builder::initList0
            ((Builder *)local_548,(Builder *)local_160,2);
  List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Builder::operator[]
            (&local_570,(Builder *)local_548,0);
  capnproto_test::capnp::test::TestLists::Struct0::Builder::setF(&local_570);
  List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Builder::operator[]
            (&local_5a0,(Builder *)local_548,1);
  capnproto_test::capnp::test::TestLists::Struct0::Builder::setF(&local_5a0);
  capnproto_test::capnp::test::TestLists::Builder::initList1
            ((Builder *)local_5d0,(Builder *)local_160,4);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_5f8,(Builder *)local_5d0,0);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_5f8,true);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_620,(Builder *)local_5d0,1);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_620,false);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_648,(Builder *)local_5d0,2);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_648,true);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&l_2.builder.structDataSize,(Builder *)local_5d0,3);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF
            ((Builder *)&l_2.builder.structDataSize,true);
  capnproto_test::capnp::test::TestLists::Builder::initList8
            ((Builder *)local_698,(Builder *)local_160,2);
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            (&local_6c0,(Builder *)local_698,0);
  capnproto_test::capnp::test::TestLists::Struct8::Builder::setF(&local_6c0,'{');
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&l_3.builder.structDataSize,(Builder *)local_698,1);
  capnproto_test::capnp::test::TestLists::Struct8::Builder::setF
            ((Builder *)&l_3.builder.structDataSize,'-');
  capnproto_test::capnp::test::TestLists::Builder::initList16
            ((Builder *)local_710,(Builder *)local_160,2);
  List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
            (&local_738,(Builder *)local_710,0);
  capnproto_test::capnp::test::TestLists::Struct16::Builder::setF(&local_738,0x3039);
  List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&l_4.builder.structDataSize,(Builder *)local_710,1);
  capnproto_test::capnp::test::TestLists::Struct16::Builder::setF
            ((Builder *)&l_4.builder.structDataSize,0x1a85);
  capnproto_test::capnp::test::TestLists::Builder::initList32
            ((Builder *)local_788,(Builder *)local_160,2);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            (&local_7b0,(Builder *)local_788,0);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF(&local_7b0,0x75bcd15);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&l_5.builder.structDataSize,(Builder *)local_788,1);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF
            ((Builder *)&l_5.builder.structDataSize,0xdfb38d2);
  capnproto_test::capnp::test::TestLists::Builder::initList64
            ((Builder *)local_800,(Builder *)local_160,2);
  List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Builder::operator[]
            (&local_828,(Builder *)local_800,0);
  capnproto_test::capnp::test::TestLists::Struct64::Builder::setF(&local_828,0x462d53c8abac0);
  List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&l_6.builder.structDataSize,(Builder *)local_800,1);
  capnproto_test::capnp::test::TestLists::Struct64::Builder::setF
            ((Builder *)&l_6.builder.structDataSize,0x85561edaa4b87);
  capnproto_test::capnp::test::TestLists::Builder::initListP
            ((Builder *)local_878,(Builder *)local_160,2);
  List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
            (&local_8a0,(Builder *)local_878,0);
  Text::Reader::Reader((Reader *)&local_8b0,"foo");
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF(&local_8a0,(Reader)local_8b0);
  List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
            (&local_8d8,(Builder *)local_878,1);
  Text::Reader::Reader((Reader *)&l_7.builder.structDataSize,"bar");
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF
            (&local_8d8,(Reader)stack0xfffffffffffff718);
  capnproto_test::capnp::test::TestLists::Builder::initInt32ListList
            ((Builder *)local_910,(Builder *)local_160,3);
  local_92c[0] = 1;
  local_92c[1] = 2;
  local_92c[2] = 3;
  local_920 = local_92c;
  local_918 = 3;
  value_04._M_len = 3;
  value_04._M_array = local_920;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_910,0,value_04);
  local_948[0] = 4;
  local_948[1] = 5;
  local_940 = local_948;
  local_938 = 2;
  value_03._M_len = 2;
  value_03._M_array = local_940;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_910,1,value_03);
  l_8.builder.structPointerCount = 0x4ff2;
  l_8.builder.elementSize = 0xbc;
  l_8.builder._39_1_ = 0;
  value_02._M_len = 1;
  value_02._M_array = (iterator)&l_8.builder.structPointerCount;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_910,2,value_02);
  capnproto_test::capnp::test::TestLists::Builder::initTextListList
            ((Builder *)local_988,(Builder *)local_160,3);
  Text::Reader::Reader(&local_9b8,"foo");
  Text::Reader::Reader(&local_9a8,"bar");
  local_998 = &local_9b8;
  local_990 = 2;
  value_01._M_len = 2;
  value_01._M_array = local_998;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_988,0,value_01);
  Text::Reader::Reader(&local_9d8,"baz");
  local_9c8 = &local_9d8;
  local_9c0 = 1;
  value_00._M_len = 1;
  value_00._M_array = local_9c8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_988,1,value_00);
  Text::Reader::Reader((Reader *)&l_9.builder.structDataSize,"qux");
  Text::Reader::Reader(&local_9f8,"corge");
  local_9e8 = &l_9.builder.structDataSize;
  local_9e0 = 2;
  value._M_len = 2;
  value._M_array = (iterator)local_9e8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_988,2,value);
  capnproto_test::capnp::test::TestLists::Builder::initStructListList
            ((Builder *)local_a30,(Builder *)local_160,2);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init(&local_a58,(EVP_PKEY_CTX *)local_a30);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init(&local_a80,(EVP_PKEY_CTX *)local_a30);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::operator[](&local_ad0,(Builder *)local_a30,0);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_aa8,&local_ad0,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_aa8,0x7b);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::operator[](&local_b20,(Builder *)local_a30,0);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_af8,&local_b20,1);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_af8,0x1c8);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::operator[](&local_b70,(Builder *)local_a30,1);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_b48,&local_b70,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_b48,0x315);
  AVar10 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  defaultBuilder.moreSegments.builder.disposer = (ArrayDisposer *)AVar10.ptr;
  pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
                      &defaultBuilder.moreSegments.builder.disposer,0);
  auStack_b88 = (undefined1  [8])pAVar4->ptr;
  segment.ptr = (word *)pAVar4->size_;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_c88,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestListDefaults>
            (&local_cb0,(MessageBuilder *)local_c88);
  capnproto_test::capnp::test::TestListDefaults::Builder::getLists
            ((Builder *)&defaultSegment.size_,&local_cb0);
  _auStack_cf8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_c88);
  pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_cf8,0);
  local_ce8 = (undefined1  [8])pAVar4->ptr;
  defaultSegment.ptr = (word *)pAVar4->size_;
  sVar5 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)local_ce8);
  sVar6 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_b88);
  if (sVar5 != sVar6) {
    local_cf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_cf9 != false) {
      local_d08 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)local_ce8);
      i = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_b88);
      kj::_::Debug::log<char_const(&)[61],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x200,ERROR,
                 "\"failed: expected \" \"(defaultSegment.size()) == (segment.size())\", defaultSegment.size(), segment.size()"
                 ,(char (*) [61])"failed: expected (defaultSegment.size()) == (segment.size())",
                 &local_d08,&i);
      local_cf9 = false;
    }
  }
  local_d18 = 0;
  while( true ) {
    uVar2 = local_d18;
    local_d20 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_b88);
    sStack_d28 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)local_ce8);
    WVar7 = kj::min<unsigned_long,unsigned_long>(&local_d20,&stack0xfffffffffffff2d8);
    if (WVar7 <= uVar2) break;
    pwVar8 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)local_ce8);
    uVar1 = pwVar8[local_d18].content;
    pwVar8 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_b88);
    if (uVar1 != pwVar8[local_d18].content) {
      local_d29 = kj::_::Debug::shouldLog(ERROR);
      while (local_d29 != false) {
        pwVar8 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)local_ce8);
        pwVar8 = pwVar8 + local_d18;
        pwVar9 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_b88);
        kj::_::Debug::log<char_const(&)[139],unsigned_long_const&,unsigned_long_const&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x204,ERROR,
                   "\"failed: expected \" \"(reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i]) == (reinterpret_cast<const uint64_t*>(segment.begin())[i])\", reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i], reinterpret_cast<const uint64_t*>(segment.begin())[i]"
                   ,(char (*) [139])
                    "failed: expected (reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i]) == (reinterpret_cast<const uint64_t*>(segment.begin())[i])"
                   ,&pwVar8->content,&pwVar9[local_d18].content);
        local_d29 = false;
      }
    }
    local_d18 = local_d18 + 1;
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_c88);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, SmallStructLists) {
  // In this test, we will manually initialize TestListDefaults.lists to match the default
  // value and verify that we end up with the same encoding that the compiler produces.

  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestListDefaults>();
  auto sl = root.initLists();

  // Verify that all the lists are actually empty.
  EXPECT_EQ(0u, sl.getList0 ().size());
  EXPECT_EQ(0u, sl.getList1 ().size());
  EXPECT_EQ(0u, sl.getList8 ().size());
  EXPECT_EQ(0u, sl.getList16().size());
  EXPECT_EQ(0u, sl.getList32().size());
  EXPECT_EQ(0u, sl.getList64().size());
  EXPECT_EQ(0u, sl.getListP ().size());
  EXPECT_EQ(0u, sl.getInt32ListList().size());
  EXPECT_EQ(0u, sl.getTextListList().size());
  EXPECT_EQ(0u, sl.getStructListList().size());

  { auto l = sl.initList0 (2); l[0].setF(VOID);              l[1].setF(VOID); }
  { auto l = sl.initList1 (4); l[0].setF(true);              l[1].setF(false);
                               l[2].setF(true);              l[3].setF(true); }
  { auto l = sl.initList8 (2); l[0].setF(123u);              l[1].setF(45u); }
  { auto l = sl.initList16(2); l[0].setF(12345u);            l[1].setF(6789u); }
  { auto l = sl.initList32(2); l[0].setF(123456789u);        l[1].setF(234567890u); }
  { auto l = sl.initList64(2); l[0].setF(1234567890123456u); l[1].setF(2345678901234567u); }
  { auto l = sl.initListP (2); l[0].setF("foo");             l[1].setF("bar"); }

  {
    auto l = sl.initInt32ListList(3);
    l.set(0, {1, 2, 3});
    l.set(1, {4, 5});
    l.set(2, {12341234});
  }

  {
    auto l = sl.initTextListList(3);
    l.set(0, {"foo", "bar"});
    l.set(1, {"baz"});
    l.set(2, {"qux", "corge"});
  }

  {
    auto l = sl.initStructListList(2);
    l.init(0, 2);
    l.init(1, 1);

    l[0][0].setInt32Field(123);
    l[0][1].setInt32Field(456);
    l[1][0].setInt32Field(789);
  }

  kj::ArrayPtr<const word> segment = builder.getSegmentsForOutput()[0];

  // Initialize another message such that it copies the default value for that field.
  MallocMessageBuilder defaultBuilder;
  defaultBuilder.getRoot<TestListDefaults>().getLists();
  kj::ArrayPtr<const word> defaultSegment = defaultBuilder.getSegmentsForOutput()[0];

  // Should match...
  EXPECT_EQ(defaultSegment.size(), segment.size());

  for (size_t i = 0; i < kj::min(segment.size(), defaultSegment.size()); i++) {
    EXPECT_EQ(reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i],
              reinterpret_cast<const uint64_t*>(segment.begin())[i]);
  }
}